

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>
* __thiscall
fasttext::FastText::getNgramVectors
          (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>
           *__return_storage_ptr__,FastText *this,string *word)

{
  long i;
  ulong uVar1;
  long lVar2;
  vector<int,_std::allocator<int>_> ngrams;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  substrings;
  Vector vec;
  _Vector_base<int,_std::allocator<int>_> local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  _Vector_base<float,_std::allocator<float>_> local_80;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>
  local_68;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Dictionary::getSubwords
            ((this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,word,(vector<int,_std::allocator<int>_> *)&local_b8,&local_98);
  if ((ulong)((long)local_b8._M_impl.super__Vector_impl_data._M_finish -
              (long)local_b8._M_impl.super__Vector_impl_data._M_start >> 2) <=
      (ulong)((long)local_98.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_98.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    lVar2 = 0;
    for (uVar1 = 0;
        uVar1 < (ulong)((long)local_b8._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_b8._M_impl.super__Vector_impl_data._M_start >> 2);
        uVar1 = uVar1 + 1) {
      Vector::Vector((Vector *)&local_80,
                     (long)((this->args_).
                            super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           dim);
      i = (long)local_b8._M_impl.super__Vector_impl_data._M_start[uVar1];
      if (-1 < i) {
        if (this->quant_ == true) {
          Vector::addRow((Vector *)&local_80,
                         (this->qinput_).
                         super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,i)
          ;
        }
        else {
          Vector::addRow((Vector *)&local_80,
                         (this->input_).
                         super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,i);
        }
      }
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_fasttext::Vector,_true>
                (&local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&((local_98.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar2),
                 (Vector *)&local_80);
      std::
      vector<std::pair<std::__cxx11::string,fasttext::Vector>,std::allocator<std::pair<std::__cxx11::string,fasttext::Vector>>>
      ::emplace_back<std::pair<std::__cxx11::string,fasttext::Vector>>
                ((vector<std::pair<std::__cxx11::string,fasttext::Vector>,std::allocator<std::pair<std::__cxx11::string,fasttext::Vector>>>
                  *)__return_storage_ptr__,&local_68);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fasttext::Vector>
      ::~pair(&local_68);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_80);
      lVar2 = lVar2 + 0x20;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_b8);
    return __return_storage_ptr__;
  }
  __assert_fail("ngrams.size() <= substrings.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/fasttext.cc"
                ,0x1eb,
                "std::vector<std::pair<std::string, Vector>> fasttext::FastText::getNgramVectors(const std::string &) const"
               );
}

Assistant:

std::vector<std::pair<std::string, Vector>> FastText::getNgramVectors(
		const std::string& word) const {
	std::vector<std::pair<std::string, Vector>> result;
	std::vector<int32_t> ngrams;
	std::vector<std::string> substrings;
	dict_->getSubwords(word, ngrams, substrings);
	assert(ngrams.size() <= substrings.size());
	for (int32_t i = 0; i < ngrams.size(); i++) {
		Vector vec(args_->dim);
		if (ngrams[i] >= 0) {
			if (quant_) {
				vec.addRow(*qinput_, ngrams[i]);
			} else {
				vec.addRow(*input_, ngrams[i]);
			}
		}
		result.push_back(std::make_pair(substrings[i], std::move(vec)));
	}
	return result;
}